

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::delete_objects
          (TestCaseBase<glcts::ArraysOfArrays::Interface::ES> *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->context_id->m_renderCtx->_vptr_RenderContext[3])();
  if (this->program_object_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x448))();
    this->program_object_id = 0;
  }
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1680))(0);
  return;
}

Assistant:

void TestCaseBase<API>::delete_objects(void)
{
	const glw::Functions& gl = context_id.getRenderContext().getFunctions();

	/* Release all ES objects that may have been created by iterate() */
	if (program_object_id != 0)
	{
		gl.deleteProgram(program_object_id);
		program_object_id = 0;
	}

	/* Use default program object to be sure the objects were released. */
	gl.useProgram(0);
}